

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

counting_iterator __thiscall
fmt::v6::internal::float_writer<char>::prettify<fmt::v6::internal::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  counting_iterator cVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  uint uVar12;
  long lVar13;
  char *pcVar14;
  _Distance __n;
  bool bVar15;
  
  uVar1 = this->num_digits_;
  uVar9 = (ulong)uVar1;
  iVar6 = this->exp_;
  lVar13 = (long)(int)uVar1;
  uVar12 = iVar6 + uVar1;
  uVar8 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar8 & 0xff) == 1) {
    iVar6 = (this->specs_).precision - uVar1;
    lVar3 = (ulong)(iVar6 - 1) + 1;
    if (iVar6 < 1) {
      lVar3 = 0;
    }
    bVar15 = (uVar8 >> 0x15 & 1) == 0;
    if (bVar15) {
      lVar3 = 0;
    }
    lVar10 = it.count_ - (bVar15 && (int)uVar1 < 2);
    pcVar14 = this->digits_ + ~(ulong)this->digits_ + lVar10 + 2 + lVar13;
    if ((int)uVar1 < 2) {
      pcVar14 = (char *)(lVar10 + 2);
    }
    cVar4 = write_exponent<char,fmt::v6::internal::counting_iterator>
                      (uVar12 - 1,(counting_iterator)((long)pcVar14 + lVar3 + 1));
    return (counting_iterator)cVar4.count_;
  }
  if (iVar6 < 0) {
    if ((int)uVar12 < 1) {
      iVar6 = -uVar12;
      if (uVar1 == 0) {
        iVar7 = (this->specs_).precision;
        iVar2 = iVar6;
        if (SBORROW4(iVar7,iVar6) != (int)(iVar7 + uVar12) < 0) {
          iVar2 = iVar7;
        }
        if (-1 < iVar7) {
          iVar6 = iVar2;
        }
      }
      if (0 < (int)uVar1 && (char)((uVar8 & 0x200000) >> 0x15) == '\0') {
        do {
          if (this->digits_[uVar9 - 1] != '0') goto LAB_00146216;
          bVar15 = 1 < (long)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar15);
        uVar9 = 0;
      }
LAB_00146216:
      iVar7 = (int)uVar9;
      if (((uVar8 & 0x200000) == 0 && iVar6 == 0) && iVar7 == 0) {
        cVar4.count_ = it.count_ + 1;
      }
      else {
        sVar11 = it.count_ + 3 + (ulong)(iVar6 - 1);
        if (iVar6 < 1) {
          sVar11 = it.count_ + 2;
        }
        cVar4.count_ = (long)iVar7 + sVar11;
        if (iVar7 < 1) {
          cVar4.count_ = sVar11;
        }
      }
    }
    else {
      pcVar14 = this->digits_;
      uVar9 = (ulong)uVar12;
      pcVar5 = pcVar14 + uVar9 + (it.count_ - (long)pcVar14);
      if ((uVar8 >> 0x15 & 1) == 0) {
        uVar8 = uVar1 - 1;
        if ((int)uVar12 < (int)(uVar1 - 1)) {
          uVar8 = uVar12;
        }
        do {
          if (pcVar14[lVar13 + -1] != '0') {
            uVar8 = (uint)lVar13;
            break;
          }
          lVar13 = lVar13 + -1;
        } while ((long)uVar9 < lVar13);
        pcVar14 = pcVar14 + (it.count_ - (long)pcVar14) + (long)(int)uVar8;
        if ((int)uVar8 <= (int)uVar12) {
          pcVar14 = pcVar5;
        }
        cVar4.count_ = (size_t)(pcVar14 + (uVar8 != uVar12));
      }
      else {
        iVar6 = (this->specs_).precision;
        iVar7 = iVar6 - uVar1;
        cVar4.count_ = (size_t)(pcVar5 + (lVar13 - uVar9) + 1);
        if ((iVar7 != 0 && (int)uVar1 <= iVar6) && (0 < iVar7)) {
          cVar4.count_ = (size_t)(pcVar5 + (ulong)(iVar7 - 1) + (lVar13 - uVar9) + 2);
        }
      }
    }
  }
  else {
    lVar3 = 0;
    if (iVar6 != 0) {
      lVar3 = (ulong)(iVar6 - 1) + 1;
    }
    cVar4.count_ = lVar13 + it.count_;
    if ((int)uVar1 < 1) {
      cVar4.count_ = it.count_;
    }
    cVar4.count_ = cVar4.count_ + lVar3;
    iVar6 = (this->specs_).precision;
    if ((iVar6 < 0 | (byte)(uVar8 >> 0x15) & 1) == 1) {
      if (iVar6 - uVar12 == 0 || iVar6 < (int)uVar12) {
        cVar4.count_ = (cVar4.count_ - ((uVar8 & 0xff) == 2)) + 2;
      }
      else {
        cVar4.count_ = cVar4.count_ + ((iVar6 - uVar12) - 1) + 2;
      }
    }
  }
  return (counting_iterator)cVar4.count_;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }